

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_Leader::GetBBox
          (ON_OBSOLETE_V5_Leader *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_2dPoint *pOVar1;
  bool bVar2;
  int bGrowBox_00;
  undefined3 in_register_00000009;
  uint c;
  long lVar3;
  ON_3dPointArray P;
  ON_BoundingBox local_98;
  ON_SimpleArray<ON_3dPoint> local_60;
  ON_3dPoint local_48;
  
  ON_BoundingBox::ON_BoundingBox(&local_98);
  if (CONCAT31(in_register_00000009,bGrowBox) == 0) {
LAB_004c75f5:
    c = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
    bGrowBox_00 = 0;
    if ((int)c < 1) {
      return false;
    }
  }
  else {
    local_98.m_min.x = *boxmin;
    local_98.m_min.y = boxmin[1];
    local_98.m_min.z = boxmin[2];
    local_98.m_max.x = *boxmax;
    local_98.m_max.y = boxmax[1];
    local_98.m_max.z = boxmax[2];
    bVar2 = ON_BoundingBox::IsValid(&local_98);
    if (!bVar2) {
      ON_BoundingBox::Destroy(&local_98);
      goto LAB_004c75f5;
    }
    c = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
    bGrowBox_00 = 1;
    if ((int)c < 1) goto LAB_004c7698;
  }
  ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_60,c);
  for (lVar3 = 0; (ulong)c << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    ON_Plane::PointAt(&local_48,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,
                      *(double *)((long)&pOVar1->x + lVar3),*(double *)((long)&pOVar1->y + lVar3));
    ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
  }
  bVar2 = ON_3dPointArray::GetBoundingBox((ON_3dPointArray *)&local_60,&local_98,bGrowBox_00);
  ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_60);
  if ((char)bGrowBox_00 == '\0' && !bVar2) {
    return false;
  }
LAB_004c7698:
  *boxmin = local_98.m_min.x;
  boxmin[1] = local_98.m_min.y;
  boxmin[2] = local_98.m_min.z;
  *boxmax = local_98.m_max.x;
  boxmax[1] = local_98.m_max.y;
  boxmax[2] = local_98.m_max.z;
  return true;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetBBox(
        double* boxmin,
        double* boxmax,
        bool bGrowBox
        ) const
{
  ON_BoundingBox bbox;
  if ( bGrowBox )
  {
    bbox.m_min.x = boxmin[0]; 
    bbox.m_min.y = boxmin[1]; 
    bbox.m_min.z = boxmin[2];
    bbox.m_max.x = boxmax[0]; 
    bbox.m_max.y = boxmax[1]; 
    bbox.m_max.z = boxmax[2];
    if ( !bbox.IsValid() )
    {
      bbox.Destroy();
      bGrowBox = false;
    }
  }

  const int point_count = m_points.Count();
  if ( point_count > 0 )
  {
    ON_3dPointArray P(point_count);
    int i;
    for ( i = 0; i < point_count; i++ )
    {
      ON_2dPoint uv = m_points[i];
      P.Append( m_plane.PointAt(uv.x,uv.y));
    }
    if ( P.GetBoundingBox(bbox,bGrowBox?true:false) )
      bGrowBox = true;
  }

  if ( bGrowBox )
  {
    boxmin[0] = bbox.m_min.x; 
    boxmin[1] = bbox.m_min.y; 
    boxmin[2] = bbox.m_min.z; 
    boxmax[0] = bbox.m_max.x; 
    boxmax[1] = bbox.m_max.y; 
    boxmax[2] = bbox.m_max.z; 
  }

  return bGrowBox;
}